

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

ValueLength __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
findDataOffset(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,
              uint8_t head)

{
  uint uVar1;
  uint8_t *puVar2;
  ValueLength value;
  byte in_SIL;
  uint8_t *start;
  uint fsm;
  ValueLength local_8;
  
  uVar1 = SliceStaticData::FirstSubMap[in_SIL];
  puVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::start
                     ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                      0x127b8f);
  if (uVar1 == 0) {
    value = readVariableValueLength<false>(puVar2 + 1);
    local_8 = getVariableValueLength(value);
    local_8 = local_8 + 1;
  }
  else if ((uVar1 < 3) && (puVar2[2] != '\0')) {
    local_8 = 2;
  }
  else if ((uVar1 < 4) && (puVar2[3] != '\0')) {
    local_8 = 3;
  }
  else if ((uVar1 < 6) && (puVar2[5] != '\0')) {
    local_8 = 5;
  }
  else {
    local_8 = 9;
  }
  return local_8;
}

Assistant:

ValueLength findDataOffset(uint8_t head) const noexcept {
    // Must be called for a non-empty array or object at start():
    VELOCYPACK_ASSERT(head != 0x01 && head != 0x0a && head <= 0x14);
    unsigned int fsm = SliceStaticData::FirstSubMap[head];
    uint8_t const* start = this->start();
    if (fsm == 0) {
      // need to calculate the offset by reading the dynamic length
      VELOCYPACK_ASSERT(head == 0x13 || head == 0x14);
      return 1 + arangodb::velocypack::getVariableValueLength(
                     readVariableValueLength<false>(start + 1));
    }
    if (fsm <= 2 && start[2] != 0) {
      return 2;
    }
    if (fsm <= 3 && start[3] != 0) {
      return 3;
    }
    if (fsm <= 5 && start[5] != 0) {
      return 5;
    }
    return 9;
  }